

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_factory.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::subject::SubjectFactory::FX::FXBase::SetTenor
          (FXBase *this,string *tenor_key,string *settlement_key,Tenor *tenor)

{
  FX *pFVar1;
  string *key;
  __type _Var2;
  bool bVar3;
  Tenor *pTVar4;
  Tenor *far_tenor_00;
  ostream *poVar5;
  InvalidSubjectException *pIVar6;
  byte local_631;
  string local_628;
  undefined1 local_601;
  string local_600;
  stringstream local_5e0 [8];
  stringstream ss_2;
  ostream local_5d0 [383];
  undefined1 local_451;
  string local_450;
  string local_430;
  stringstream local_410 [8];
  stringstream ss_1;
  ostream local_400 [376];
  undefined1 local_288 [8];
  string far_tenor;
  string local_260;
  string local_240;
  stringstream local_220 [8];
  stringstream ss;
  ostream local_210 [376];
  undefined1 local_98 [8];
  string near_tenor;
  string local_68;
  string local_48;
  Tenor *local_28;
  Tenor *tenor_local;
  string *settlement_key_local;
  string *tenor_key_local;
  FXBase *this_local;
  
  local_28 = tenor;
  tenor_local = (Tenor *)settlement_key;
  settlement_key_local = tenor_key;
  tenor_key_local = (string *)this;
  Tenor::ToString_abi_cxx11_(&local_48,tenor);
  Tenor::ToString_abi_cxx11_(&local_68,(Tenor *)Tenor::BROKEN_DATE);
  _Var2 = std::operator==(&local_48,&local_68);
  local_631 = 0;
  if (_Var2) {
    bVar3 = SubjectBuilder::ContainsKey
                      (&(this->outer_class_->super_MandatoryFieldsSubjectCreator).subject_builder_,
                       &tenor_local->tenor_code_);
    local_631 = bVar3 ^ 0xff;
  }
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  if ((local_631 & 1) != 0) {
    MandatoryFieldsSubjectCreator::AddMandatoryKey
              (&this->outer_class_->super_MandatoryFieldsSubjectCreator,&tenor_local->tenor_code_);
  }
  _Var2 = std::operator==(settlement_key_local,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          SubjectKey::FAR_TENOR_abi_cxx11_);
  if (_Var2) {
    bVar3 = SubjectBuilder::ContainsKey
                      (&(this->outer_class_->super_MandatoryFieldsSubjectCreator).subject_builder_,
                       (string *)SubjectKey::TENOR_abi_cxx11_);
    if (bVar3) {
      SubjectBuilder::GetComponent
                ((string *)local_98,
                 &(this->outer_class_->super_MandatoryFieldsSubjectCreator).subject_builder_,
                 (string *)SubjectKey::TENOR_abi_cxx11_);
      pTVar4 = Tenor::GetTenorFromString((string *)local_98);
      bVar3 = Tenor::IsValidNearFarTenor(pTVar4,local_28);
      if (!bVar3) {
        std::__cxx11::stringstream::stringstream(local_220);
        poVar5 = std::operator<<(local_210,"Invalid near/far tenor combination: [TENOR] ");
        poVar5 = std::operator<<(poVar5,(string *)local_98);
        poVar5 = std::operator<<(poVar5," [FAR] ");
        Tenor::ToString_abi_cxx11_(&local_240,local_28);
        std::operator<<(poVar5,(string *)&local_240);
        std::__cxx11::string::~string((string *)&local_240);
        far_tenor.field_2._M_local_buf[0xf] = '\x01';
        pIVar6 = (InvalidSubjectException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringstream::str();
        InvalidSubjectException::InvalidSubjectException(pIVar6,&local_260);
        far_tenor.field_2._M_local_buf[0xf] = '\0';
        __cxa_throw(pIVar6,&InvalidSubjectException::typeinfo,
                    InvalidSubjectException::~InvalidSubjectException);
      }
      std::__cxx11::string::~string((string *)local_98);
    }
  }
  else {
    _Var2 = std::operator==(settlement_key_local,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            SubjectKey::TENOR_abi_cxx11_);
    if (!_Var2) {
      std::__cxx11::stringstream::stringstream(local_5e0);
      poVar5 = std::operator<<(local_5d0,"Invalid tenor key: ");
      std::operator<<(poVar5,(string *)settlement_key_local);
      local_601 = 1;
      pIVar6 = (InvalidSubjectException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringstream::str();
      InvalidSubjectException::InvalidSubjectException(pIVar6,&local_600);
      local_601 = 0;
      __cxa_throw(pIVar6,&InvalidSubjectException::typeinfo,
                  InvalidSubjectException::~InvalidSubjectException);
    }
    bVar3 = SubjectBuilder::ContainsKey
                      (&(this->outer_class_->super_MandatoryFieldsSubjectCreator).subject_builder_,
                       (string *)SubjectKey::FAR_TENOR_abi_cxx11_);
    if (bVar3) {
      SubjectBuilder::GetComponent
                ((string *)local_288,
                 &(this->outer_class_->super_MandatoryFieldsSubjectCreator).subject_builder_,
                 (string *)SubjectKey::FAR_TENOR_abi_cxx11_);
      pTVar4 = local_28;
      far_tenor_00 = Tenor::GetTenorFromString((string *)local_288);
      bVar3 = Tenor::IsValidNearFarTenor(pTVar4,far_tenor_00);
      if (!bVar3) {
        std::__cxx11::stringstream::stringstream(local_410);
        poVar5 = std::operator<<(local_400,"Invalid near/far tenor combination: [TENOR] ");
        Tenor::ToString_abi_cxx11_(&local_430,local_28);
        poVar5 = std::operator<<(poVar5,(string *)&local_430);
        poVar5 = std::operator<<(poVar5," [FAR] ");
        std::operator<<(poVar5,(string *)local_288);
        std::__cxx11::string::~string((string *)&local_430);
        local_451 = 1;
        pIVar6 = (InvalidSubjectException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringstream::str();
        InvalidSubjectException::InvalidSubjectException(pIVar6,&local_450);
        local_451 = 0;
        __cxa_throw(pIVar6,&InvalidSubjectException::typeinfo,
                    InvalidSubjectException::~InvalidSubjectException);
      }
      std::__cxx11::string::~string((string *)local_288);
    }
  }
  key = settlement_key_local;
  pFVar1 = this->outer_class_;
  Tenor::ToString_abi_cxx11_(&local_628,local_28);
  SubjectBuilder::SetComponent
            (&(pFVar1->super_MandatoryFieldsSubjectCreator).subject_builder_,key,&local_628);
  std::__cxx11::string::~string((string *)&local_628);
  return;
}

Assistant:

void SubjectFactory::FX::FXBase::SetTenor(const std::string& tenor_key, const std::string& settlement_key, const Tenor& tenor)
{
    if (tenor.ToString() == Tenor::BROKEN_DATE.ToString() && !outer_class_.subject_builder_.ContainsKey(settlement_key))
    {
        outer_class_.AddMandatoryKey(settlement_key);
    }

    if (tenor_key == SubjectKey::FAR_TENOR)
    {
        if (outer_class_.subject_builder_.ContainsKey(SubjectKey::TENOR))
        {
            std::string near_tenor = outer_class_.subject_builder_.GetComponent(SubjectKey::TENOR);

            if (!Tenor::IsValidNearFarTenor(Tenor::GetTenorFromString(near_tenor), tenor))
            {
                std::stringstream ss;
                ss << "Invalid near/far tenor combination: [TENOR] " <<  near_tenor << " [FAR] " << tenor.ToString();
                throw InvalidSubjectException(ss.str());
            }
        }
    }
    else if (tenor_key == SubjectKey::TENOR)
    {
        if (outer_class_.subject_builder_.ContainsKey(SubjectKey::FAR_TENOR))
        {
            std::string far_tenor = outer_class_.subject_builder_.GetComponent(SubjectKey::FAR_TENOR);

            if (!Tenor::IsValidNearFarTenor(tenor, Tenor::GetTenorFromString(far_tenor)))
            {
                std::stringstream ss;
                ss << "Invalid near/far tenor combination: [TENOR] " <<  tenor.ToString() << " [FAR] " << far_tenor;
                throw InvalidSubjectException(ss.str());
            }
        }
    }
    else
    {
        std::stringstream ss;
        ss << "Invalid tenor key: " <<  tenor_key;
        throw InvalidSubjectException(ss.str());
    }

    outer_class_.subject_builder_.SetComponent(tenor_key, tenor.ToString());
}